

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall TestMaterial::GeneralTest(TestMaterial *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  S_Object *pSVar6;
  clock_t cVar7;
  double *pdVar8;
  clock_t cVar9;
  long lVar10;
  ostream *poVar11;
  double dVar12;
  double dVar13;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  Vector3T<double,_false> local_4b0;
  Vector3T<double,_false> local_498;
  Vector3T<double,_false> local_480;
  double local_468;
  Scalar is_1;
  long i_1;
  double local_450;
  double local_448;
  Vector3T<double,_false> local_440;
  Vector3T<double,_false> local_428;
  Vector3T<double,_false> local_410;
  double local_3f8;
  Scalar is;
  long i;
  Point3 p;
  double local_3c8;
  double local_3c0;
  undefined1 local_3b8 [8];
  Vector3 v_1;
  double d_1;
  double c_1;
  double b_1;
  double a_1;
  long j_1;
  clock_t lostTime;
  double local_368;
  double local_360;
  undefined1 local_358 [8];
  Vector3 v;
  double d;
  double c;
  double b;
  double a;
  long j;
  clock_t end;
  clock_t begin;
  double angle;
  double local_2f8;
  double local_2f0;
  undefined1 local_2e8 [8];
  Vector3 axe;
  double local_2c8;
  double local_2c0;
  undefined1 local_2b8 [8];
  Vector3 position;
  CD_Scene testscene;
  ulong local_238;
  size_t k;
  long local_220;
  fstream outfile;
  ostream local_210 [512];
  TestMaterial *local_10;
  TestMaterial *this_local;
  
  local_10 = this;
  std::fstream::fstream(&local_220);
  std::operator|(_S_out,_S_trunc);
  std::fstream::open((char *)&local_220,0x10c21c);
  std::ios_base::precision((ios_base *)((long)&local_220 + *(long *)(local_220 + -0x18)),0x12);
  local_238 = 0;
  while( true ) {
    sVar5 = std::vector<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>::size(&this->stppObjects);
    if (sVar5 <= local_238) break;
    sch::CD_Scene::CD_Scene((CD_Scene *)&position.m_z);
    sch::CD_Scene::operator[](&this->sObj,0);
    sch::CD_Scene::addObject((S_Object *)&position.m_z);
    sch::CD_Scene::operator[](&this->sObj,0);
    sch::S_Object::resetTransformation();
    std::vector<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>::operator[]
              (&this->stppObjects,local_238);
    sch::CD_Scene::addObject((S_Object *)&position.m_z);
    local_2c0 = 0.0;
    local_2c8 = 1.6666666666666667;
    axe.m_z = 1.4285714285714286;
    CD_Matrix::Vector3T<double,_false>::Vector3T
              ((Vector3T<double,_false> *)local_2b8,&local_2c0,&local_2c8,&axe.m_z);
    CD_Matrix::Vector3T<double,_false>::operator*=
              ((Vector3T<double,_false> *)local_2b8,(double *)&DispersionScale);
    local_2f0 = 0.0;
    local_2f8 = 0.0;
    angle = 1.0;
    CD_Matrix::Vector3T<double,_false>::Vector3T
              ((Vector3T<double,_false> *)local_2e8,&local_2f0,&local_2f8,&angle);
    begin = 0;
    pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
    sch::S_Object::setOrientation((double *)pSVar6,(Vector3T *)&begin);
    pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
    sch::S_Object::setPosition(pSVar6);
    sch::CD_Scene::sceneProximityQuery();
    display();
    clock();
    for (a = 0.0; (long)a < 1000000; a = (double)((long)a + 1)) {
      iVar1 = rand();
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      v.m_z = (double)iVar4 / 2147483647.0;
      dVar12 = log((double)iVar1 / 2147483647.0);
      dVar12 = sqrt(dVar12 * -2.0);
      local_360 = cos(((double)iVar2 / 2147483647.0) * 6.283185307179586);
      local_360 = dVar12 * local_360;
      dVar12 = log((double)iVar2 / 2147483647.0);
      dVar12 = sqrt(dVar12 * -2.0);
      local_368 = cos(((double)iVar1 / 2147483647.0) * 6.283185307179586);
      local_368 = dVar12 * local_368;
      dVar12 = log((double)iVar3 / 2147483647.0);
      dVar12 = sqrt(dVar12 * -2.0);
      dVar13 = cos(v.m_z * 6.283185307179586);
      lostTime = (clock_t)(dVar12 * dVar13);
      CD_Matrix::Vector3T<double,_false>::Vector3T
                ((Vector3T<double,_false> *)local_358,&local_360,&local_368,(double *)&lostTime);
    }
    clock();
    clock();
    for (a_1 = 0.0; (long)a_1 < 1000000; a_1 = (double)((long)a_1 + 1)) {
      iVar1 = rand();
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      v_1.m_z = (double)iVar4 / 2147483647.0;
      dVar12 = log((double)iVar1 / 2147483647.0);
      dVar12 = sqrt(dVar12 * -2.0);
      local_3c0 = cos(((double)iVar2 / 2147483647.0) * 6.283185307179586);
      local_3c0 = dVar12 * local_3c0;
      dVar12 = log((double)iVar2 / 2147483647.0);
      dVar12 = sqrt(dVar12 * -2.0);
      local_3c8 = cos(((double)iVar1 / 2147483647.0) * 6.283185307179586);
      local_3c8 = dVar12 * local_3c8;
      dVar12 = log((double)iVar3 / 2147483647.0);
      dVar12 = sqrt(dVar12 * -2.0);
      dVar13 = cos(v_1.m_z * 6.283185307179586);
      p.m_z = dVar12 * dVar13;
      CD_Matrix::Vector3T<double,_false>::Vector3T
                ((Vector3T<double,_false> *)local_3b8,&local_3c0,&local_3c8,&p.m_z);
      pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
      (**(code **)(*(long *)pSVar6 + 0x20))(&i,pSVar6,local_3b8);
    }
    clock();
    cVar7 = clock();
    for (is = 0.0; (long)is < 10000; is = (Scalar)((long)is + 1)) {
      local_3f8 = (double)(long)is;
      dVar12 = sin(local_3f8 * 0.0006000000000000001);
      dVar12 = sin(dVar12 * 42.0);
      pdVar8 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)local_2e8,0);
      *pdVar8 = dVar12;
      dVar12 = sin(local_3f8 * 0.0006000000000000001);
      dVar12 = sin(dVar12 * -43.0);
      pdVar8 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)local_2e8,1);
      *pdVar8 = dVar12;
      dVar12 = sin(local_3f8 * 0.00030000000000000003);
      dVar12 = cos(dVar12 * 83.0);
      pdVar8 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)local_2e8,2);
      *pdVar8 = dVar12;
      dVar12 = sin(local_3f8 * 0.0015);
      dVar12 = sin(dVar12 * 0.2);
      dVar12 = sin(dVar12 * 97.0);
      begin = (clock_t)(dVar12 * 4.0);
      pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
      sch::S_Object::setOrientation((double *)pSVar6,(Vector3T *)&begin);
      pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
      dVar12 = sin(local_3f8 * 0.0006000000000000001);
      local_448 = sin(dVar12 * 20.0);
      dVar12 = sin(local_3f8 * 0.00045);
      local_450 = sin(dVar12 * -69.0);
      dVar12 = sin(local_3f8 * 0.0006000000000000001);
      i_1 = (long)sin(dVar12 * 20.0);
      CD_Matrix::Vector3T<double,_false>::Vector3T(&local_440,&local_448,&local_450,(double *)&i_1);
      CD_Matrix::Vector3T<double,_false>::operator*(&local_428,&local_440,&AnimationScale);
      CD_Matrix::Vector3T<double,false>::operator+
                (&local_410,(Vector3T<double,false> *)local_2b8,&local_428);
      sch::S_Object::setPosition(pSVar6);
    }
    cVar9 = clock();
    lVar10 = cVar9 - cVar7;
    cVar7 = clock();
    for (is_1 = 0.0; (long)is_1 < 10000; is_1 = (Scalar)((long)is_1 + 1)) {
      local_468 = (double)(long)is_1;
      dVar12 = sin(local_468 * 0.0006000000000000001);
      dVar12 = sin(dVar12 * 42.0);
      pdVar8 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)local_2e8,0);
      *pdVar8 = dVar12;
      dVar12 = sin(local_468 * 0.0006000000000000001);
      dVar12 = sin(dVar12 * -43.0);
      pdVar8 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)local_2e8,1);
      *pdVar8 = dVar12;
      dVar12 = sin(local_468 * 0.00030000000000000003);
      dVar12 = cos(dVar12 * 83.0);
      pdVar8 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)local_2e8,2);
      *pdVar8 = dVar12;
      dVar12 = sin(local_468 * 0.0015);
      dVar12 = sin(dVar12 * 0.2);
      dVar12 = sin(dVar12 * 97.0);
      begin = (clock_t)(dVar12 * 4.0);
      pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
      sch::S_Object::setOrientation((double *)pSVar6,(Vector3T *)&begin);
      pSVar6 = sch::CD_Scene::operator[]((CD_Scene *)&position.m_z,1);
      dVar12 = sin(local_468 * 0.0006000000000000001);
      local_4b8 = sin(dVar12 * 20.0);
      dVar12 = sin(local_468 * 0.00045);
      local_4c0 = sin(dVar12 * -69.0);
      dVar12 = sin(local_468 * 0.0006000000000000001);
      local_4c8 = sin(dVar12 * 20.0);
      CD_Matrix::Vector3T<double,_false>::Vector3T(&local_4b0,&local_4b8,&local_4c0,&local_4c8);
      CD_Matrix::Vector3T<double,_false>::operator*(&local_498,&local_4b0,&AnimationScale);
      CD_Matrix::Vector3T<double,false>::operator+
                (&local_480,(Vector3T<double,false> *)local_2b8,&local_498);
      sch::S_Object::setPosition(pSVar6);
      sch::CD_Scene::sceneProximityQuery();
      display();
    }
    cVar9 = clock();
    poVar11 = (ostream *)
              std::ostream::operator<<(local_210,(double)((cVar9 - cVar7) - lVar10) / 1000000.0);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (poVar11,((double)((cVar9 - cVar7) - lVar10) / 1000000.0) / 10000.0);
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,(double)((cVar9 - cVar7) - lVar10) / 1000000.0);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = (ostream *)
              std::ostream::operator<<
                        (poVar11,((double)((cVar9 - cVar7) - lVar10) / 1000000.0) / 10000.0);
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    sch::CD_Scene::~CD_Scene((CD_Scene *)&position.m_z);
    local_238 = local_238 + 1;
  }
  std::fstream::close();
  std::fstream::~fstream(&local_220);
  return;
}

Assistant:

void TestMaterial::GeneralTest()
{
  std::fstream outfile;
  outfile.open("/tmp/sch_generaltest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);


  for (size_t k=0; k<stppObjects.size(); k++)
  {
    CD_Scene testscene;
    testscene.addObject(sObj[0]);

    sObj[0]->resetTransformation();

    testscene.addObject(&(stppObjects[k]));

    Vector3 position(
      (1.+7%5-3.),
      ((5%6-3)*(5.0/6)),
      ((5%7-3)*(5.0/7))
    );
    position *= DispersionScale;

    Vector3 axe(0, 0, 1);
    double angle(0);

    testscene[1]->setOrientation(angle,axe);
    testscene[1]->setPosition(position);

    testscene.sceneProximityQuery();

    display();

    clock_t begin, end;

    begin=clock();
    for (long j=0; j<RandomTestEnd; j++)
    {
      double a = (rand()/double(RAND_MAX)) ;
      double b = (rand()/double(RAND_MAX)) ;
      double c = (rand()/double(RAND_MAX)) ;
      double d = (rand()/double(RAND_MAX)) ;
      Vector3 v(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
    }
    end=clock();

    clock_t lostTime=end-begin;

    begin=clock();
    for (long j=0; j<RandomTestEnd; j++)
    {
      double a = (rand()/double(RAND_MAX)) ;
      double b = (rand()/double(RAND_MAX)) ;
      double c = (rand()/double(RAND_MAX)) ;
      double d = (rand()/double(RAND_MAX)) ;

      Vector3 v(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));

#ifdef DO_TEST
      Point3 p=testscene[1]->support(v);

# ifndef OUTPUT_FILE
      (void) p;
#else
      outfile<<p<<std::endl;
# endif // OUTPUT_FILE

#endif // DO_TEST
    }

#ifdef OUTPUT_FILE
    outfile.close();
#endif

    end=clock();


    begin=clock();

    for (long i=0; i<AnimationEnd; i++)
    {
      Scalar is= Scalar(i);
      axe[0] =  sin((42)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed*is)));

      testscene[1]->setOrientation(angle,axe);

      testscene[1]->setPosition( position + Vector3(sin((20*(1))*sin(0.2*AnimationSpeed*is)),
                                 sin((71-140*(1))*sin(0.15*AnimationSpeed*is)),
                                 sin((20)*sin(0.2*AnimationSpeed*is)))*AnimationScale);
    }

    end=clock();

    lostTime=end-begin;

    begin=clock();

    for (long i=0; i<AnimationEnd; i++)
    {
      Scalar is = Scalar(i);
      axe[0] =  sin((42)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed*is)));

      testscene[1]->setOrientation(angle,axe);

      testscene[1]->setPosition( position + Vector3(sin((20*(1))*sin(0.2*AnimationSpeed*is)),
                                 sin((71-140*(1))*sin(0.15*AnimationSpeed*is)),
                                 sin((20)*sin(0.2*AnimationSpeed*is)))*AnimationScale);

#ifdef DO_TEST
      testscene.sceneProximityQuery();
#endif

#ifdef TEST_HOLD
      std::cout<<i<<std::endl;
      system("pause");
#endif

      display();
    }
    end=clock();
    outfile   <<((double)(end- begin-lostTime) / CLOCKS_PER_SEC) << " " << ((double)(end - begin-lostTime) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;
    std::cout <<((double)(end- begin-lostTime) / CLOCKS_PER_SEC) << " " << ((double)(end - begin-lostTime) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;
  }
  outfile.close();
}